

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void selectPopWith(Walker *pWalker,Select *p)

{
  Parse *pPVar1;
  Select *pSVar2;
  With *pWith;
  Parse *pParse;
  Select *p_local;
  Walker *pWalker_local;
  
  pPVar1 = pWalker->pParse;
  if ((pPVar1->pWith != (With *)0x0) && (p->pPrior == (Select *)0x0)) {
    pSVar2 = findRightmost(p);
    if (pSVar2->pWith != (With *)0x0) {
      pPVar1->pWith = pSVar2->pWith->pOuter;
    }
  }
  return;
}

Assistant:

static void selectPopWith(Walker *pWalker, Select *p){
  Parse *pParse = pWalker->pParse;
  if( pParse->pWith && p->pPrior==0 ){
    With *pWith = findRightmost(p)->pWith;
    if( pWith!=0 ){
      assert( pParse->pWith==pWith );
      pParse->pWith = pWith->pOuter;
    }
  }
}